

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ospf-packet.cc
# Opt level: O0

void __thiscall NetworkLsa::NetworkLsa(NetworkLsa *this,istream *is)

{
  uint64_t uVar1;
  size_type sVar2;
  char *in_RSI;
  undefined8 *in_RDI;
  uint8_t arr [4];
  uint16_t len;
  istream *in_stack_ffffffffffffffa8;
  Lsa *in_stack_ffffffffffffffb0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  uint8_t local_16 [4];
  short local_12;
  char *local_10;
  
  local_10 = in_RSI;
  Lsa::Lsa(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  *in_RDI = &PTR__NetworkLsa_0017d4a0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x155573);
  local_12 = (short)*(undefined4 *)(in_RDI + 5) + -0x14;
  std::istream::read(local_10,(long)local_16);
  uVar1 = arr2num(local_16,'\x04');
  *(int *)((long)in_RDI + 0x2c) = (int)uVar1;
  while (local_12 = local_12 + -4, local_12 != 0) {
    std::istream::read(local_10,(long)local_16);
    this_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 7);
    arr2num(local_16,'\x04');
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (this_00,(value_type_conflict1 *)in_stack_ffffffffffffffa8);
  }
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 7));
  *(int *)(in_RDI + 6) = (int)sVar2;
  return;
}

Assistant:

NetworkLsa::NetworkLsa(std::istream& is) : Lsa(is)
{
    uint16_t len = tlen - sizeof(LsaHeader);
    uint8_t  arr[4];
    is.read((char*)&arr, 4);
    mask = arr2num(arr, 4);
    len  = len - 4;
    while (len != 0)
    {
        is.read((char*)&arr, 4);
        attach_routers.push_back(arr2num(arr, 4));
        len = len - 4;
    }
    attach_num = attach_routers.size();
}